

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_common.cpp
# Opt level: O1

RK_S32 mpp_log2_16bit(RK_U32 v)

{
  ulong uVar1;
  bool bVar2;
  
  bVar2 = (v & 0xff00) != 0;
  uVar1 = (ulong)(v >> 8);
  if (!bVar2) {
    uVar1 = (ulong)v;
  }
  return (uint)""[uVar1] + (uint)bVar2 * 8;
}

Assistant:

RK_S32 mpp_log2_16bit(RK_U32 v)
{
    RK_S32 n = 0;
    if (v & 0xff00) {
        v >>= 8;
        n += 8;
    }
    n += log2_tab[v];

    return n;
}